

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

ebml_string * Copy(ebml_string *Element)

{
  char *pcVar1;
  ebml_string *Result;
  ebml_string *Element_local;
  
  Element_local = (ebml_string *)EBML_ElementCreate(Element,(Element->Base).Context,0,-1);
  if (Element_local != (ebml_string *)0x0) {
    pcVar1 = (char *)malloc((Element->Base).DataSize + 1);
    Element_local->Buffer = pcVar1;
    if (Element_local->Buffer == (char *)0x0) {
      NodeDelete((node *)Element_local);
      Element_local = (ebml_string *)0x0;
    }
    else {
      strncpy(Element_local->Buffer,Element->Buffer,(Element->Base).DataSize + 1);
      (Element_local->Base).bValueIsSet = (Element->Base).bValueIsSet;
      (Element_local->Base).DataSize = (Element->Base).DataSize;
      (Element_local->Base).ElementPosition = (Element->Base).ElementPosition;
      (Element_local->Base).SizeLength = (Element->Base).SizeLength;
      (Element_local->Base).SizePosition = (Element->Base).SizePosition;
      (Element_local->Base).EndPosition = (Element->Base).EndPosition;
      (Element_local->Base).bNeedDataSizeUpdate = (Element->Base).bNeedDataSizeUpdate;
    }
  }
  return Element_local;
}

Assistant:

static ebml_element *Copy(const ebml_master *Element)
{
    ebml_element *i, *Elt;
    ebml_master *Result = (ebml_master*)EBML_ElementCreate(Element,Element->Base.Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        EBML_MasterErase(Result); // delete the children elements created by default
        Result->Base.bValueIsSet = Element->Base.bValueIsSet;
        Result->Base.DataSize = Element->Base.DataSize;
        Result->Base.ElementPosition = Element->Base.ElementPosition;
        Result->Base.SizeLength = Element->Base.SizeLength;
        Result->Base.SizePosition = Element->Base.SizePosition;
        Result->Base.EndPosition = Element->Base.EndPosition;
        Result->Base.bNeedDataSizeUpdate = Element->Base.bNeedDataSizeUpdate;
        Result->CheckSumStatus = Element->CheckSumStatus;
        for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
        {
            Elt = EBML_ElementCopy(i);
            if (!Elt || EBML_MasterAppend(Result, Elt)!=ERR_NONE)
            {
                NodeDelete((node*)Result);
                Result = NULL;
                break;
            }
        }
    }
    return (ebml_element*)Result;
}